

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tfidfinit.cpp
# Opt level: O1

set<int,_std::less<int>,_std::allocator<int>_> *
queryfromhashmap(set<int,_std::less<int>,_std::allocator<int>_> *__return_storage_ptr__,
                vector<int,_std::allocator<int>_> *qu,int offset,int d,int treeid)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_const_iterator<int> _Var2;
  const_iterator cVar3;
  mapped_type *pmVar4;
  int *__args;
  long lVar5;
  long lVar6;
  map<point,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<point>,_std::allocator<std::pair<const_point,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
  *this;
  point f;
  key_type local_58;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_58.f.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  local_58.f.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_58.f.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (int *)0x0;
  local_58.d = PAA_DIMENSION[d];
  if (0 < local_58.d) {
    lVar5 = (long)offset << 2;
    lVar6 = 0;
    do {
      __args = (int *)((long)(qu->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_start + lVar5);
      if (local_58.f.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_58.f.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&local_58,
                   (iterator)
                   local_58.f.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,__args);
      }
      else {
        *local_58.f.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish = *__args;
        local_58.f.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_58.f.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      lVar6 = lVar6 + 1;
      lVar5 = lVar5 + 4;
    } while (lVar6 < PAA_DIMENSION[d]);
  }
  this = tree[d] + treeid;
  cVar3 = std::
          _Rb_tree<point,_std::pair<const_point,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_point,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::less<point>,_std::allocator<std::pair<const_point,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
          ::find(&this->_M_t,&local_58);
  p_Var1 = &(this->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)cVar3._M_node != p_Var1) {
    pmVar4 = std::
             map<point,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<point>,_std::allocator<std::pair<const_point,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
             ::operator[](this,&local_58);
    _Var2._M_node = (pmVar4->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    pmVar4 = std::
             map<point,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<point>,_std::allocator<std::pair<const_point,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
             ::operator[](this,&local_58);
    std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
    _M_insert_range_unique<std::_Rb_tree_const_iterator<int>>
              ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
               __return_storage_ptr__,_Var2,
               (_Rb_tree_const_iterator<int>)&(pmVar4->_M_t)._M_impl.super__Rb_tree_header);
  }
  if (0 < PAA_DIMENSION[d]) {
    lVar5 = 0;
    do {
      local_58.f.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar5] =
           local_58.f.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start[lVar5] + -1;
      cVar3 = std::
              _Rb_tree<point,_std::pair<const_point,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_point,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::less<point>,_std::allocator<std::pair<const_point,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
              ::find(&this->_M_t,&local_58);
      if ((_Rb_tree_header *)cVar3._M_node != p_Var1) {
        pmVar4 = std::
                 map<point,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<point>,_std::allocator<std::pair<const_point,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                 ::operator[](this,&local_58);
        _Var2._M_node = (pmVar4->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        pmVar4 = std::
                 map<point,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<point>,_std::allocator<std::pair<const_point,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                 ::operator[](this,&local_58);
        std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
        _M_insert_range_unique<std::_Rb_tree_const_iterator<int>>
                  ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                   __return_storage_ptr__,_Var2,
                   (_Rb_tree_const_iterator<int>)&(pmVar4->_M_t)._M_impl.super__Rb_tree_header);
      }
      local_58.f.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar5] =
           local_58.f.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start[lVar5] + 2;
      cVar3 = std::
              _Rb_tree<point,_std::pair<const_point,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_point,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::less<point>,_std::allocator<std::pair<const_point,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
              ::find(&this->_M_t,&local_58);
      if ((_Rb_tree_header *)cVar3._M_node != p_Var1) {
        pmVar4 = std::
                 map<point,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<point>,_std::allocator<std::pair<const_point,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                 ::operator[](this,&local_58);
        _Var2._M_node = (pmVar4->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        pmVar4 = std::
                 map<point,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<point>,_std::allocator<std::pair<const_point,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                 ::operator[](this,&local_58);
        std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
        _M_insert_range_unique<std::_Rb_tree_const_iterator<int>>
                  ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                   __return_storage_ptr__,_Var2,
                   (_Rb_tree_const_iterator<int>)&(pmVar4->_M_t)._M_impl.super__Rb_tree_header);
      }
      local_58.f.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar5] =
           local_58.f.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start[lVar5] + -1;
      lVar5 = lVar5 + 1;
    } while (lVar5 < PAA_DIMENSION[d]);
  }
  if (local_58.f.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_58.f.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

set<int> queryfromhashmap(vector<int> &qu, int offset, int d, int treeid) {
    set<int> cnt;
    point f;
    f.d = PAA_DIMENSION[d];
    for (int i = 0; i < PAA_DIMENSION[d]; ++i) {
        f.f.push_back(qu[offset + i]);
    }
    if (tree[d][treeid].count(f)) {
        cnt.insert(tree[d][treeid][f].begin(), tree[d][treeid][f].end());
    }
    for (int i = 0; i < PAA_DIMENSION[d]; ++i) {
        f.f[i] -= 1;
        if (tree[d][treeid].count(f)) {
            cnt.insert(tree[d][treeid][f].begin(), tree[d][treeid][f].end());
        }
        f.f[i] += 2;
        if (tree[d][treeid].count(f)) {
            cnt.insert(tree[d][treeid][f].begin(), tree[d][treeid][f].end());
        }
        f.f[i] -= 1;
    }
    return cnt;
}